

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::LabelInstr::AddLabelRef(LabelInstr *this,BranchInstr *branchRef)

{
  BranchInstr *local_18;
  BranchInstr *branchRef_local;
  LabelInstr *this_local;
  
  local_18 = branchRef;
  branchRef_local = (BranchInstr *)this;
  SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            (&(this->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>,
             &local_18);
  return;
}

Assistant:

void
LabelInstr::AddLabelRef(BranchInstr *branchRef)
{
    this->labelRefs.Prepend(branchRef);
}